

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_digest.cpp
# Opt level: O3

void __thiscall argparse::args_t::parse_rc_option(args_t *this,char *str)

{
  int iVar1;
  
  iVar1 = strcmp(str,"complement");
  if (iVar1 == 0) {
    this->rc = complement;
  }
  else {
    iVar1 = strcmp(str,"nocomplement");
    if (iVar1 != 0) {
      ERROR("invalid file operation: %s",str);
      return;
    }
    this->rc = nocomplement;
  }
  return;
}

Assistant:

void args_t::parse_rc_option( const char * str )
    {
        if (!strcmp (str, "complement")) {
            rc = complement;
        } else if (!strcmp (str, "nocomplement")) {
            rc = nocomplement;
        } else  {
            ERROR( "invalid file operation: %s", str );
        }
    }